

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonlinear_Buffer.cpp
# Opt level: O0

channel_t * __thiscall
Nonlinear_Buffer::channel(channel_t *__return_storage_ptr__,Nonlinear_Buffer *this,int i)

{
  int i_local;
  Nonlinear_Buffer *this_local;
  
  __return_storage_ptr__->center = &this->buf;
  if ((1 < i) && (i < 5)) {
    __return_storage_ptr__->center = &this->tnd;
  }
  __return_storage_ptr__->left = __return_storage_ptr__->center;
  __return_storage_ptr__->right = __return_storage_ptr__->center;
  return __return_storage_ptr__;
}

Assistant:

Nonlinear_Buffer::channel_t Nonlinear_Buffer::channel( int i )
{
	channel_t c;
	c.center = &buf;
	if ( 2 <= i && i <= 4 )
		c.center = &tnd; // only use for triangle, noise, and dmc
	c.left   = c.center;
	c.right  = c.center;
	return c;
}